

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

uint do_with_oh<unsigned_int>
               (qpdf_data qpdf,qpdf_oh oh,function<unsigned_int_()> *fallback,
               function<unsigned_int_(QPDFObjectHandle_&)> *fn)

{
  uint uVar1;
  anon_class_40_2_fa08e0b4 local_90;
  function<unsigned_int_(_qpdf_data_*)> local_68;
  function<unsigned_int_()> local_48;
  function<unsigned_int_(QPDFObjectHandle_&)> *local_28;
  function<unsigned_int_(QPDFObjectHandle_&)> *fn_local;
  function<unsigned_int_()> *fallback_local;
  qpdf_data p_Stack_10;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_28 = fn;
  fn_local = (function<unsigned_int_(QPDFObjectHandle_&)> *)fallback;
  fallback_local._4_4_ = oh;
  p_Stack_10 = qpdf;
  std::function<unsigned_int_()>::function(&local_48,fallback);
  std::function<unsigned_int_(QPDFObjectHandle_&)>::function(&local_90.fn,fn);
  local_90.oh = fallback_local._4_4_;
  std::function<unsigned_int(_qpdf_data*)>::
  function<do_with_oh<unsigned_int>(_qpdf_data*,unsigned_int,std::function<unsigned_int()>,std::function<unsigned_int(QPDFObjectHandle&)>)::_lambda(_qpdf_data*)_1_,void>
            ((function<unsigned_int(_qpdf_data*)> *)&local_68,&local_90);
  uVar1 = trap_oh_errors<unsigned_int>(qpdf,&local_48,&local_68);
  std::function<unsigned_int_(_qpdf_data_*)>::~function(&local_68);
  do_with_oh<unsigned_int>(_qpdf_data*,unsigned_int,std::function<unsigned_int()>,std::function<unsigned_int(QPDFObjectHandle&)>)
  ::{lambda(_qpdf_data*)#1}::~function((_lambda__qpdf_data___1_ *)&local_90);
  std::function<unsigned_int_()>::~function(&local_48);
  return uVar1;
}

Assistant:

static RET
do_with_oh(
    qpdf_data qpdf,
    qpdf_oh oh,
    std::function<RET()> fallback,
    std::function<RET(QPDFObjectHandle&)> fn)
{
    return trap_oh_errors<RET>(qpdf, fallback, [fn, oh](qpdf_data q) {
        auto i = q->oh_cache.find(oh);
        bool result = ((i != q->oh_cache.end()) && (i->second).get());
        if (!result) {
            QTC::TC("qpdf", "qpdf-c invalid object handle");
            throw QPDFExc(
                qpdf_e_internal,
                q->qpdf->getFilename(),
                std::string("C API object handle ") + std::to_string(oh),
                0,
                "attempted access to unknown object handle");
        }
        return fn(*(q->oh_cache[oh]));
    });
}